

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_fs_open(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  int fd;
  uv_stdio_container_t stdio [1];
  uv_buf_t local_3a0;
  uv_pipe_t in;
  uv_fs_t fs_req;
  uv_write_t write_req;
  
  fd = uv_fs_open((uv_loop_t *)0x0,&fs_req,"/dev/null",2,0,(uv_fs_cb)0x0);
  if (fd < 0) {
    pcVar4 = "fd >= 0";
    uVar3 = 0x627;
  }
  else {
    uv_fs_req_cleanup(&fs_req);
    init_process_options("spawn_helper8",exit_cb);
    puVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(puVar2,&in,0);
    if (iVar1 == 0) {
      options.stdio = stdio;
      stdio[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
      options.stdio_count = 1;
      stdio[0].data.stream = (uv_stream_t *)&in;
      puVar2 = uv_default_loop();
      iVar1 = uv_spawn(puVar2,&process,&options);
      if (iVar1 == 0) {
        local_3a0 = uv_buf_init((char *)&fd,4);
        iVar1 = uv_write(&write_req,(uv_stream_t *)&in,&local_3a0,1,write_cb);
        if (iVar1 == 0) {
          puVar2 = uv_default_loop();
          iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
          if (iVar1 == 0) {
            iVar1 = uv_fs_close((uv_loop_t *)0x0,&fs_req,fd,(uv_fs_cb)0x0);
            if (iVar1 == 0) {
              if (exit_cb_called == 1) {
                if (close_cb_called == 2) {
                  puVar2 = uv_default_loop();
                  close_loop(puVar2);
                  puVar2 = uv_default_loop();
                  iVar1 = uv_loop_close(puVar2);
                  if (iVar1 == 0) {
                    return 0;
                  }
                  pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                  uVar3 = 0x63e;
                }
                else {
                  pcVar4 = "close_cb_called == 2";
                  uVar3 = 0x63c;
                }
              }
              else {
                pcVar4 = "exit_cb_called == 1";
                uVar3 = 0x63b;
              }
            }
            else {
              pcVar4 = "0 == uv_fs_close(NULL, &fs_req, fd, NULL)";
              uVar3 = 0x639;
            }
          }
          else {
            pcVar4 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
            uVar3 = 0x638;
          }
        }
        else {
          pcVar4 = "0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb)";
          uVar3 = 0x636;
        }
      }
      else {
        pcVar4 = "0 == uv_spawn(uv_default_loop(), &process, &options)";
        uVar3 = 0x633;
      }
    }
    else {
      pcVar4 = "0 == uv_pipe_init(uv_default_loop(), &in, 0)";
      uVar3 = 0x62c;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(spawn_fs_open) {
  int fd;
  uv_fs_t fs_req;
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[1];

  fd = uv_fs_open(NULL, &fs_req, "/dev/null", O_RDWR, 0, NULL);
  ASSERT(fd >= 0);
  uv_fs_req_cleanup(&fs_req);

  init_process_options("spawn_helper8", exit_cb);

  ASSERT(0 == uv_pipe_init(uv_default_loop(), &in, 0));

  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  ASSERT(0 == uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init((char*) &fd, sizeof(fd));
  ASSERT(0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == uv_fs_close(NULL, &fs_req, fd, NULL));

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2);  /* One for `in`, one for process */

  MAKE_VALGRIND_HAPPY();
  return 0;
}